

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O2

Vec4 __thiscall
tcu::TextureCubeView::gather
          (TextureCubeView *this,Sampler *sampler,float s,float t,float r,int componentNdx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  Vec4 (*in_RCX) [4];
  Vec4 (*dst) [4];
  undefined4 in_register_00000014;
  WrapMode *pWVar4;
  long lVar5;
  bool *pbVar6;
  float c;
  undefined1 extraout_XMM0 [16];
  undefined1 auVar7 [16];
  ulong uVar8;
  Vec4 VVar9;
  CubeFaceFloatCoords CVar10;
  Vec4 sampleColors [4];
  ConstPixelBufferAccess faceAccesses [6];
  float local_160;
  Vector<float,_4> local_158 [4];
  ConstPixelBufferAccess local_118 [6];
  
  pWVar4 = (WrapMode *)CONCAT44(in_register_00000014,componentNdx);
  lVar5 = 0;
  dst = in_RCX;
  do {
    ConstPixelBufferAccess::ConstPixelBufferAccess
              ((ConstPixelBufferAccess *)((long)local_118[0].m_size.m_data + lVar5 + -8));
    lVar5 = lVar5 + 0x28;
  } while (lVar5 != 0xf0);
  pbVar6 = (bool *)&sampler->wrapR;
  for (lVar5 = 0; lVar5 != 0x1e; lVar5 = lVar5 + 5) {
    dst = *(Vec4 (**) [4])pbVar6;
    *(void **)((long)(&local_118[0].m_pitch + 1) + lVar5 * 8) = *(void **)(*dst)[2].m_data;
    uVar1 = *(undefined8 *)(*dst)[0].m_data;
    uVar2 = *(undefined8 *)((*dst)[0].m_data + 2);
    uVar3 = *(undefined8 *)((*dst)[1].m_data + 2);
    *(undefined8 *)(local_118[0].m_pitch.m_data + lVar5 * 2 + -1) = *(undefined8 *)(*dst)[1].m_data;
    *(undefined8 *)(local_118[0].m_pitch.m_data + lVar5 * 2 + 1) = uVar3;
    *(undefined8 *)(local_118[0].m_size.m_data + lVar5 * 2 + -2) = uVar1;
    *(undefined8 *)(local_118[0].m_size.m_data + lVar5 * 2) = uVar2;
    pbVar6 = pbVar6 + 8;
  }
  local_158[0].m_data[0] = s;
  local_158[0].m_data[1] = t;
  local_158[0].m_data[2] = r;
  CVar10 = getCubeFaceCoords((Vec3 *)local_158);
  c = CVar10.t;
  local_160 = CVar10.s;
  if ((char)pWVar4[6] != CLAMP_TO_EDGE) {
    local_160 = unnormalize(*pWVar4,local_160,local_118[0].m_size.m_data[0]);
    c = unnormalize(pWVar4[1],c,local_118[0].m_size.m_data[0]);
  }
  lVar5 = 0;
  do {
    Vector<float,_4>::Vector((Vector<float,_4> *)((long)local_158[0].m_data + lVar5));
    lVar5 = lVar5 + 0x10;
  } while (lVar5 != 0x40);
  uVar8 = (ulong)(uint)c;
  getCubeLinearSamples(&local_118,CVar10.face,local_160,c,(int)local_158,dst);
  Vector<float,_4>::Vector((Vector<float,_4> *)this);
  auVar7 = extraout_XMM0;
  for (lVar5 = 0; lVar5 != 0x10; lVar5 = lVar5 + 4) {
    auVar7 = ZEXT416((uint)local_158[*(int *)((long)&DAT_00238dc0 + lVar5)].m_data[(int)in_RCX]);
    *(float *)((long)this->m_levels + lVar5 + -8) =
         local_158[*(int *)((long)&DAT_00238dc0 + lVar5)].m_data[(int)in_RCX];
  }
  VVar9.m_data._0_8_ = auVar7._0_8_;
  VVar9.m_data[2] = (float)(int)uVar8;
  VVar9.m_data[3] = (float)(int)(uVar8 >> 0x20);
  return (Vec4)VVar9.m_data;
}

Assistant:

Vec4 TextureCubeView::gather (const Sampler& sampler, float s, float t, float r, int componentNdx) const
{
	DE_ASSERT(sampler.compare == Sampler::COMPAREMODE_NONE);

	ConstPixelBufferAccess faceAccesses[CUBEFACE_LAST];
	for (int i = 0; i < (int)CUBEFACE_LAST; i++)
		faceAccesses[i] = m_levels[i][0];

	const CubeFaceFloatCoords	coords	= getCubeFaceCoords(Vec3(s, t, r));
	const int					size	= faceAccesses[0].getWidth();
	// Non-normalized coordinates.
	float						u		= coords.s;
	float						v		= coords.t;

	if (sampler.normalizedCoords)
	{
		u = unnormalize(sampler.wrapS, coords.s, size);
		v = unnormalize(sampler.wrapT, coords.t, size);
	}

	Vec4 sampleColors[4];
	getCubeLinearSamples(faceAccesses, coords.face, u, v, 0, sampleColors);

	const int	sampleIndices[4] = { 2, 3, 1, 0 }; // \note Gather returns the samples in a non-obvious order.
	Vec4		result;
	for (int i = 0; i < 4; i++)
		result[i] = sampleColors[sampleIndices[i]][componentNdx];

	return result;
}